

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.hpp
# Opt level: O0

size_t __thiscall
chain::str::replace<(chain::str::case_t)1>
          (str *this,string *data,string_view from,string_view to,optional<unsigned_long> count)

{
  string_view needle;
  string_view haystack;
  size_t sVar1;
  ulong uVar2;
  size_type sVar3;
  char *pcVar4;
  const_pointer pvVar5;
  size_type sVar6;
  size_t local_58;
  size_t pos;
  unsigned_long local_48;
  unsigned_long max;
  size_t replaced;
  string *data_local;
  string_view to_local;
  string_view from_local;
  
  data_local = (string *)from._M_str;
  to_local._M_len = to._M_len;
  max = 0;
  replaced = (size_t)this;
  to_local._M_str = (char *)data;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    pos = std::numeric_limits<unsigned_long>::max();
    local_48 = std::optional<unsigned_long>::value_or<unsigned_long>(&count,&pos);
    if (local_48 == 0) {
      return max;
    }
    local_58 = 0;
    do {
      haystack = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)replaced);
      needle._M_str = (char *)from._M_len;
      needle._M_len = (size_t)to_local._M_str;
      sVar3 = find<(chain::str::case_t)1>(haystack,needle,local_58);
      sVar1 = replaced;
      if (sVar3 == 0xffffffffffffffff) {
        return max;
      }
      pcVar4 = (char *)std::basic_string_view<char,_std::char_traits<char>_>::length
                                 ((basic_string_view<char,_std::char_traits<char>_> *)
                                  &to_local._M_str);
      pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::data
                         ((basic_string_view<char,_std::char_traits<char>_> *)&data_local);
      std::basic_string_view<char,_std::char_traits<char>_>::length
                ((basic_string_view<char,_std::char_traits<char>_> *)&data_local);
      std::__cxx11::string::replace(sVar1,sVar3,pcVar4,(ulong)pvVar5);
      sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::length
                        ((basic_string_view<char,_std::char_traits<char>_> *)&data_local);
      local_58 = sVar6 + sVar3;
      max = max + 1;
    } while (max < local_48);
  }
  return max;
}

Assistant:

auto replace(
    std::string& data, std::string_view from, std::string_view to, std::optional<std::size_t> count = std::nullopt)
    -> std::size_t
{
    std::size_t replaced{0};

    if (!data.empty())
    {
        auto max = count.value_or(std::numeric_limits<std::size_t>::max());
        if (max == 0)
        {
            return replaced; // 0 replacements asked for...!
        }

        std::size_t pos{0};
        while ((pos = find<case_type>(data, from, pos)) != std::string_view::npos)
        {
            data.replace(pos, from.length(), to.data(), to.length());
            pos += to.length();
            ++replaced;

            if (replaced >= max)
            {
                break; // while()
            }
        }
    }

    return replaced;
}